

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O2

void inject(args *t,stateRecord *state)

{
  node *oldChild;
  
  oldChild = (state->targetEdge).child;
  CAS((state->targetEdge).parent,(ulong)(state->targetEdge).which,oldChild,
      (node *)((ulong)oldChild | 4));
}

Assistant:

void inject(struct args* t,struct stateRecord* state)
{
    struct node* parent;
    struct node* node;
    struct edge targetEdge;
    size_t which;
    bool result;
    bool i,d,p;
    struct node* temp;

    targetEdge = state->targetEdge;
    parent = targetEdge.parent;
    node = targetEdge.child;
    which = targetEdge.which;

    result = CAS(parent,which,node,setIFlag(node));
    if(!result)
    {
        temp = parent->child[which];
        i=IFlagSet(temp);
        d=DFlagSet(temp);
        p=PFlagSet(temp);

        if(i)
        {
            helpTargetNode(t,&targetEdge,1);
        }
        else if(d)
        {
            helpTargetNode(t,&state->pTargetEdge,1);
        }
        else if(p)
        {
            helpSuccessorNode(t,&state->pTargetEdge,1);
        }
        return;
    }

    result = markChildEdge(t,state,LC);
    if(!result)
    {
        return;
    }
    result = markChildEdge(t,state,RC);

    initializeTypeAndUpdateMode(t,state);
    return;
}